

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::DerefDebugExpression
          (DebugInfoManager *this,Instruction *dbg_expr)

{
  IRContext *pIVar1;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var2;
  CommonDebugInfoInstructions CVar3;
  PodType PVar4;
  array<signed_char,_4UL> aVar5;
  Instruction *pIVar6;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  deref_expr;
  string message;
  size_type __dnew;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_90;
  undefined1 local_88 [16];
  PodType local_78 [2];
  undefined1 local_70 [8];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_68;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  CVar3 = Instruction::GetCommonDebugOpcode(dbg_expr);
  if (CVar3 != CommonDebugInfoDebugExpression) {
    __assert_fail("dbg_expr->GetCommonDebugOpcode() == CommonDebugInfoDebugExpression",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x177,
                  "Instruction *spvtools::opt::analysis::DebugInfoManager::DerefDebugExpression(Instruction *)"
                 );
  }
  pIVar6 = Instruction::Clone(dbg_expr,this->context_);
  pIVar1 = this->context_;
  local_90._M_head_impl = pIVar6;
  PVar4.data._M_elems =
       (array<signed_char,_4UL>)
       Module::TakeNextIdBound
                 ((pIVar1->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((PVar4.data._M_elems == (_Type)0x0) &&
     ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_88._0_8_ = local_78;
    local_58._0_4_ = (array<signed_char,_4UL>)0x25;
    local_58._4_4_ = (array<signed_char,_4UL>)0x0;
    local_88._0_8_ = std::__cxx11::string::_M_create((ulong *)local_88,(ulong)local_58);
    local_78[0].data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)local_58._0_4_;
    local_78[1].data._M_elems = (array<signed_char,_4UL>)(array<signed_char,_4UL>)local_58._4_4_;
    *(undefined8 *)local_88._0_8_ = 0x667265766f204449;
    *(undefined8 *)(local_88._0_8_ + 8) = 0x797254202e776f6c;
    *(undefined8 *)(local_88._0_8_ + 0x10) = 0x676e696e6e757220;
    *(undefined8 *)(local_88._0_8_ + 0x18) = 0x746361706d6f6320;
    *(undefined8 *)((((PodType *)(local_88._0_8_ + 0x1c))->data)._M_elems + 1) = 0x2e7364692d746361;
    local_88._8_8_ = local_58._0_8_;
    (((PodType *)local_88._0_8_)->data)._M_elems[local_58._0_8_] = '\0';
    local_58._0_8_ = (_func_int **)0x0;
    local_58._8_8_ = 0;
    local_58._16_4_ = (array<signed_char,_4UL>)0x0;
    local_58._20_4_ = (array<signed_char,_4UL>)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar1->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)local_58,(char *)local_88._0_8_
              );
    if ((PodType *)local_88._0_8_ != local_78) {
      operator_delete((void *)local_88._0_8_,(long)local_78 + 1);
    }
  }
  if (pIVar6->has_result_id_ != false) {
    if (PVar4.data._M_elems != (_Type)0x0) {
      local_70 = (undefined1  [8])local_78;
      local_88._0_8_ = &PTR__SmallVector_00b15d78;
      local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_78[0].data._M_elems = PVar4.data._M_elems;
      local_88._8_8_ = (_func_int **)0x1;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)&((OperandData *)
                         ((((pIVar6->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_start)->words).buffer + -4))->
                         _vptr_SmallVector + (ulong)((uint)pIVar6->has_type_id_ * 0x30)),
                 (SmallVector<unsigned_int,_2UL> *)local_88);
      local_88._0_8_ = &PTR__SmallVector_00b15d78;
      if (local_68._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_68,local_68._M_head_impl);
      }
      _Var2._M_head_impl = local_90._M_head_impl;
      pIVar6 = GetDebugOperationWithDeref(this);
      aVar5._M_elems[0] = '\0';
      aVar5._M_elems[1] = '\0';
      aVar5._M_elems[2] = '\0';
      aVar5._M_elems[3] = '\0';
      if (pIVar6->has_result_id_ == true) {
        aVar5._M_elems = (_Type)Instruction::GetSingleWordOperand(pIVar6,(uint)pIVar6->has_type_id_)
        ;
      }
      local_58._24_8_ = local_58 + 0x10;
      local_58._0_8_ = &PTR__SmallVector_00b15d78;
      local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._16_4_ = aVar5._M_elems;
      local_58._8_8_ = 1;
      local_88._0_4_ = 1;
      local_88._8_8_ = &PTR__SmallVector_00b15d78;
      local_78[0].data._M_elems = (array<signed_char,_4UL>)0x0;
      local_78[1].data._M_elems = (array<signed_char,_4UL>)0x0;
      local_68._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_70;
      local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_88 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::insert
                (&(_Var2._M_head_impl)->operands_,
                 ((_Var2._M_head_impl)->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4,(value_type *)local_88);
      local_88._8_8_ = &PTR__SmallVector_00b15d78;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_60._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_60,local_60._M_head_impl);
      }
      local_60._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_58._0_8_ = &PTR__SmallVector_00b15d78;
      if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_38,local_38._M_head_impl);
      }
      pIVar6 = Instruction::InsertBefore
                         (&(((this->context_->module_)._M_t.
                             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                           ext_inst_debuginfo_).super_IntrusiveList<spvtools::opt::Instruction>.
                           sentinel_,
                          (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                           *)&local_90);
      AnalyzeDebugInst(this,pIVar6);
      if ((this->context_->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        DefUseManager::AnalyzeInstDefUse
                  ((this->context_->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,pIVar6);
      }
      if (local_90._M_head_impl != (Instruction *)0x0) {
        (*((local_90._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
      return pIVar6;
    }
    __assert_fail("res_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x2cd,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
  }
  __assert_fail("has_result_id_",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                ,0x2c8,"void spvtools::opt::Instruction::SetResultId(uint32_t)");
}

Assistant:

Instruction* DebugInfoManager::DerefDebugExpression(Instruction* dbg_expr) {
  assert(dbg_expr->GetCommonDebugOpcode() == CommonDebugInfoDebugExpression);
  std::unique_ptr<Instruction> deref_expr(dbg_expr->Clone(context()));
  deref_expr->SetResultId(context()->TakeNextId());
  deref_expr->InsertOperand(
      kDebugExpressOperandOperationIndex,
      {SPV_OPERAND_TYPE_ID, {GetDebugOperationWithDeref()->result_id()}});
  auto* deref_expr_instr =
      context()->ext_inst_debuginfo_end()->InsertBefore(std::move(deref_expr));
  AnalyzeDebugInst(deref_expr_instr);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(deref_expr_instr);
  return deref_expr_instr;
}